

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_helpers.cpp
# Opt level: O3

vector<bool,_true> *
duckdb::ParseColumnList
          (vector<bool,_true> *__return_storage_ptr__,Value *value,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,string *loption)

{
  LogicalTypeId LVar1;
  pointer pcVar2;
  int iVar3;
  vector<duckdb::Value,_true> *this;
  const_reference pvVar4;
  BinderException *pBVar5;
  string local_b8;
  vector<bool,_std::allocator<bool>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  LVar1 = (value->type_).id_;
  if (LVar1 == LIST) {
    if (value->is_null == true) {
      pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,
                 "\"%s\" expects a column list or * as parameter, it can\'t be a NULL value","");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar2 = (loption->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + loption->_M_string_length);
      BinderException::BinderException<std::__cxx11::string>(pBVar5,&local_b8,&local_70);
      __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this = ListValue::GetChildren(value);
    if ((long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_start == 0x40) {
      pvVar4 = vector<duckdb::Value,_true>::operator[](this,0);
      if ((pvVar4->type_).id_ == VARCHAR) {
        pvVar4 = vector<duckdb::Value,_true>::operator[](this,0);
        Value::GetValue<std::__cxx11::string>(&local_b8,pvVar4);
        iVar3 = ::std::__cxx11::string::compare((char *)&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if (iVar3 == 0) {
          ::std::vector<bool,_std::allocator<bool>_>::resize
                    (&local_98,
                     (long)(names->
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(names->
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5,true);
          goto LAB_013d0261;
        }
      }
    }
    ParseColumnList(__return_storage_ptr__,this,names,loption);
    if (local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
  }
  else {
    if (LVar1 != VARCHAR) {
LAB_013d0346:
      pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"\"%s\" expects a column list or * as parameter","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar2 = (loption->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + loption->_M_string_length);
      BinderException::BinderException<std::__cxx11::string>(pBVar5,&local_b8,&local_50);
      __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    Value::GetValue<std::__cxx11::string>(&local_b8,value);
    iVar3 = ::std::__cxx11::string::compare((char *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if (iVar3 != 0) goto LAB_013d0346;
    ::std::vector<bool,_std::allocator<bool>_>::resize
              (&local_98,
               (long)(names->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(names->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,true);
LAB_013d0261:
    (__return_storage_ptr__->super_vector<bool,_std::allocator<bool>_>).
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
         local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_end_of_storage;
    (__return_storage_ptr__->super_vector<bool,_std::allocator<bool>_>).
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p =
         local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_p;
    *(ulong *)&(__return_storage_ptr__->super_vector<bool,_std::allocator<bool>_>).
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base._M_offset =
         CONCAT44(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_,
                  local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
    (__return_storage_ptr__->super_vector<bool,_std::allocator<bool>_>).
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    *(ulong *)&(__return_storage_ptr__->super_vector<bool,_std::allocator<bool>_>).
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
               super__Bit_iterator_base._M_offset =
         CONCAT44(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_,
                  local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<bool> ParseColumnList(const Value &value, vector<string> &names, const string &loption) {
	vector<bool> result;

	// Only accept a list of arguments
	if (value.type().id() != LogicalTypeId::LIST) {
		// Support a single argument if it's '*'
		if (value.type().id() == LogicalTypeId::VARCHAR && value.GetValue<string>() == "*") {
			result.resize(names.size(), true);
			return result;
		}
		throw BinderException("\"%s\" expects a column list or * as parameter", loption);
	}
	if (value.IsNull()) {
		throw BinderException("\"%s\" expects a column list or * as parameter, it can't be a NULL value", loption);
	}
	auto &children = ListValue::GetChildren(value);
	// accept '*' as single argument
	if (children.size() == 1 && children[0].type().id() == LogicalTypeId::VARCHAR &&
	    children[0].GetValue<string>() == "*") {
		result.resize(names.size(), true);
		return result;
	}
	return ParseColumnList(children, names, loption);
}